

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pTextureCases.cpp
# Opt level: O1

void __thiscall deqp::gles2::Performance::Texture2DRenderCase::deinit(Texture2DRenderCase *this)

{
  pointer ppTVar1;
  pointer ppTVar2;
  
  ppTVar1 = (this->m_textures).
            super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppTVar2 = (this->m_textures).
                 super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppTVar2 != ppTVar1; ppTVar2 = ppTVar2 + 1) {
    if (*ppTVar2 != (Texture2D *)0x0) {
      (*(*ppTVar2)->_vptr_Texture2D[1])();
    }
    ppTVar1 = (this->m_textures).
              super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  ppTVar2 = (this->m_textures).
            super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppTVar1 != ppTVar2) {
    (this->m_textures).super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppTVar2;
  }
  deqp::gls::ShaderPerformanceCase::deinit(&this->super_ShaderPerformanceCase);
  return;
}

Assistant:

void Texture2DRenderCase::deinit (void)
{
	for (vector<glu::Texture2D*>::iterator i = m_textures.begin(); i != m_textures.end(); i++)
		delete *i;
	m_textures.clear();

	ShaderPerformanceCase::deinit();
}